

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.cpp
# Opt level: O2

void __thiscall
chrono::ChQuadratureTablesTriangle::ChQuadratureTablesTriangle(ChQuadratureTablesTriangle *this)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_01;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  initializer_list<double> __l_09;
  initializer_list<double> __l_10;
  initializer_list<double> __l_11;
  initializer_list<double> __l_12;
  initializer_list<double> __l_13;
  allocator_type local_b9;
  vector<double,_std::allocator<double>_> wt;
  vector<double,_std::allocator<double>_> ya;
  vector<double,_std::allocator<double>_> wt_2;
  vector<double,_std::allocator<double>_> xa;
  
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->LrootsU;
  this_01 = &this->LrootsV;
  (this->Weight).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Weight).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Weight).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd5555555555555;
  __l._M_len = 1;
  __l._M_array = (iterator)&ya;
  std::vector<double,_std::allocator<double>_>::vector(&xa,__l,(allocator_type *)&wt);
  wt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd5555555555555;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&wt;
  std::vector<double,_std::allocator<double>_>::vector(&ya,__l_00,(allocator_type *)&wt_2);
  wt_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&DAT_3ff0000000000000;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&wt_2;
  std::vector<double,_std::allocator<double>_>::vector(&wt,__l_01,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&xa);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&ya);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&wt);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ya.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xa.super__Vector_base<double,_std::allocator<double>_>);
  ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe5555555555573;
  ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fc55555555555cd;
  ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fc55555555555cd;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&ya;
  std::vector<double,_std::allocator<double>_>::vector(&xa,__l_02,(allocator_type *)&wt);
  wt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc55555555555cd;
  wt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fc55555555555cd;
  wt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fe5555555555573;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&wt;
  std::vector<double,_std::allocator<double>_>::vector(&ya,__l_03,(allocator_type *)&wt_2);
  wt_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fd5555555555519;
  wt_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x3fd5555555555519;
  wt_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x3fd5555555555519;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&wt_2;
  std::vector<double,_std::allocator<double>_>::vector(&wt,__l_04,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&xa);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&ya);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&wt);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ya.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xa.super__Vector_base<double,_std::allocator<double>_>);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd5555555555519;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fc999999999999a;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc999999999999a;
  __l_05._M_len = 4;
  __l_05._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&ya,__l_05,(allocator_type *)&wt);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd5555555555519;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fc999999999999a;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe3333333333333;
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt,__l_06,(allocator_type *)&wt_2);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xbfe2000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fe0aaaaaaaaaa8d;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe0aaaaaaaaaa8d;
  __l_07._M_len = 4;
  __l_07._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt_2,__l_07,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&ya);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&wt);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&wt_2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt_2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ya.super__Vector_base<double,_std::allocator<double>_>);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fdc8a6b8a0bd136;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fdc8a6b8a0bd136;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fbbaca3afa17920;
  __l_08._M_len = 6;
  __l_08._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&ya,__l_08,(allocator_type *)&wt);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fdc8a6b8a0bd136;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fbbaca3afa17920;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fdc8a6b8a0bd136;
  __l_09._M_len = 6;
  __l_09._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt,__l_09,(allocator_type *)&wt_2);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fcc97c497190797;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fcc97c497190797;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fcc97c497190797;
  __l_10._M_len = 6;
  __l_10._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt_2,__l_10,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&ya);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&wt);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&wt_2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt_2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ya.super__Vector_base<double,_std::allocator<double>_>);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd5555555555519;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fde16cebd738b65;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fde16cebd738b65;
  __l_11._M_len = 7;
  __l_11._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&ya,__l_11,(allocator_type *)&wt);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd5555555555519;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fde16cebd738b65;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fae931428c74410;
  __l_12._M_len = 7;
  __l_12._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt,__l_12,(allocator_type *)&wt_2);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fcccccccccccccd;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fc0f24aa6344271;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc0f24aa6344271;
  __l_13._M_len = 7;
  __l_13._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt_2,__l_13,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&ya);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&wt);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&wt_2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt_2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ya.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

ChQuadratureTablesTriangle::ChQuadratureTablesTriangle() {
    // initialize table with precomputed weights and coordinates
    {  // i=0: 1pt  deg 1
        std::vector<double> xa= {1./3.};
        std::vector<double> ya= {1./3.};
        std::vector<double> wt= {1};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->Weight.push_back(wt);
    }
    {  // i=1: 3pt  deg 2
        std::vector<double> xa= {0.166666666666670,   0.166666666666670,   0.666666666666670};
        std::vector<double> ya= {0.166666666666670,   0.666666666666670,   0.166666666666670};
        std::vector<double> wt= {0.333333333333330,   0.333333333333330,   0.333333333333330};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->Weight.push_back(wt); 
    }
    {   // i=2: 4pt  deg 3
        std::vector<double> xa= {0.333333333333330,  0.200000000000000,   0.200000000000000,  0.600000000000000};
        std::vector<double> ya= {0.333333333333330,  0.200000000000000,   0.600000000000000,  0.200000000000000};
        std::vector<double> wt= {-0.56250000000000,  0.520833333333330,   0.520833333333330,  0.520833333333330};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->Weight.push_back(wt); 
    }
    {   // i=3: 6pt  deg  4
        std::vector<double> xa= {0.445948490915970,   0.445948490915970,   0.108103018168070,   0.091576213509770,   0.091576213509770,   0.816847572980460};
        std::vector<double> ya= {0.445948490915970,   0.108103018168070,   0.445948490915970,   0.091576213509770,   0.816847572980460,   0.091576213509770};
        std::vector<double> wt= {0.223381589678010,   0.223381589678010,   0.223381589678010,   0.109951743655320,   0.109951743655320,   0.109951743655320};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->Weight.push_back(wt);
    }
    {   // i=4: 7 pt deg 5
        std::vector<double> xa= {0.333333333333330,   0.470142064105110,   0.470142064105110,   0.059715871789770,   0.101286507323460,   0.101286507323460,   0.797426985353090};
        std::vector<double> ya= {0.333333333333330,   0.470142064105110,   0.059715871789770,   0.470142064105110,   0.101286507323460,   0.797426985353090,   0.101286507323460};
        std::vector<double> wt= {0.225000000000000,   0.132394152788510,   0.132394152788510,   0.132394152788510,   0.125939180544830,   0.125939180544830,   0.125939180544830};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->Weight.push_back(wt);
    }
}